

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ColladaExporter.cpp
# Opt level: O0

void __thiscall Assimp::ColladaExporter::WriteHeader(ColladaExporter *this)

{
  undefined8 uVar1;
  bool bVar2;
  int iVar3;
  tm *__tp;
  aiNode *this_00;
  aiNode **ppaVar4;
  ostream *poVar5;
  char *pcVar6;
  float *this_01;
  float extraout_XMM0_Da;
  float extraout_XMM0_Da_00;
  float extraout_XMM0_Da_01;
  byte local_be1;
  byte local_a89;
  byte local_a19;
  allocator<char> local_9b1;
  string local_9b0;
  string local_990;
  allocator<char> local_969;
  string local_968;
  allocator<char> local_941;
  string local_940;
  string local_920;
  allocator<char> local_8f9;
  string local_8f8;
  allocator<char> local_8d1;
  string local_8d0;
  string local_8b0;
  allocator<char> local_889;
  string local_888;
  allocator<char> local_861;
  string local_860;
  string local_840;
  allocator<char> local_819;
  string local_818;
  allocator<char> local_7f1;
  string local_7f0;
  string local_7d0;
  byte local_7ab;
  byte local_7aa;
  allocator<char> local_7a9;
  string local_7a8;
  allocator<char> local_781;
  string local_780;
  string local_760;
  allocator<char> local_739;
  string local_738;
  allocator<char> local_711;
  string local_710;
  string local_6f0;
  allocator<char> local_6c9;
  string local_6c8;
  allocator<char> local_6a1;
  string local_6a0;
  string local_680;
  allocator<char> local_659;
  string local_658;
  allocator<char> local_631;
  string local_630;
  string local_610;
  byte local_5eb;
  byte local_5ea;
  allocator<char> local_5e9;
  string local_5e8;
  allocator<char> local_5c1;
  string local_5c0;
  string local_5a0;
  byte local_57b;
  byte local_57a;
  allocator<char> local_579;
  string local_578;
  undefined1 local_554 [8];
  aiString value;
  aiMetadata *meta;
  string local_140;
  aiNode *local_120;
  aiNode *root;
  aiScene *scene;
  allocator<char> local_101;
  string local_100 [8];
  string up_axis;
  ai_real scale;
  bool add_root_node;
  aiVector3D position;
  aiQuaternion rotation;
  aiVector3D scaling;
  time_t date;
  char date_str [20];
  aiMatrix3x3t<float> local_88;
  aiMatrix3x3t<float> local_64;
  aiMatrix3x3t<float> local_40;
  ColladaExporter *local_10;
  ColladaExporter *this_local;
  
  local_10 = this;
  if ((WriteHeader()::epsilon == '\0') &&
     (iVar3 = __cxa_guard_acquire(&WriteHeader()::epsilon), iVar3 != 0)) {
    WriteHeader::epsilon = Math::getEpsilon<float>();
    __cxa_guard_release(&WriteHeader()::epsilon);
  }
  if ((WriteHeader()::x_rot == '\0') &&
     (iVar3 = __cxa_guard_acquire(&WriteHeader()::x_rot), iVar3 != 0)) {
    aiMatrix3x3t<float>::aiMatrix3x3t(&local_40,0.0,-1.0,0.0,1.0,0.0,0.0,0.0,0.0,1.0);
    aiQuaterniont<float>::aiQuaterniont(&WriteHeader::x_rot,&local_40);
    __cxa_guard_release(&WriteHeader()::x_rot);
  }
  if ((WriteHeader()::y_rot == '\0') &&
     (iVar3 = __cxa_guard_acquire(&WriteHeader()::y_rot), iVar3 != 0)) {
    aiMatrix3x3t<float>::aiMatrix3x3t(&local_64,1.0,0.0,0.0,0.0,1.0,0.0,0.0,0.0,1.0);
    aiQuaterniont<float>::aiQuaterniont(&WriteHeader::y_rot,&local_64);
    __cxa_guard_release(&WriteHeader()::y_rot);
  }
  if ((WriteHeader()::z_rot == '\0') &&
     (iVar3 = __cxa_guard_acquire(&WriteHeader()::z_rot), iVar3 != 0)) {
    aiMatrix3x3t<float>::aiMatrix3x3t(&local_88,1.0,0.0,0.0,0.0,0.0,1.0,0.0,-1.0,0.0);
    aiQuaterniont<float>::aiQuaterniont(&WriteHeader::z_rot,&local_88);
    __cxa_guard_release(&WriteHeader()::z_rot);
  }
  scaling._4_8_ = time((time_t *)0x0);
  __tp = localtime((time_t *)&scaling.y);
  strftime((char *)&date,0x14,"%Y-%m-%dT%H:%M:%S",__tp);
  aiVector3t<float>::aiVector3t((aiVector3t<float> *)&rotation.y);
  aiQuaterniont<float>::aiQuaterniont((aiQuaterniont<float> *)&position.y);
  aiVector3t<float>::aiVector3t((aiVector3t<float> *)&scale);
  aiMatrix4x4t<float>::Decompose
            (&this->mScene->mRootNode->mTransformation,(aiVector3t<float> *)&rotation.y,
             (aiQuaterniont<float> *)&position.y,(aiVector3t<float> *)&scale);
  this_01 = &position.y;
  aiQuaterniont<float>::Normalize((aiQuaterniont<float> *)this_01);
  up_axis.field_2._M_local_buf[0xf] = '\0';
  up_axis.field_2._8_4_ = 0x3f800000;
  iVar3 = (int)this_01;
  std::abs(iVar3);
  if (((WriteHeader::epsilon < extraout_XMM0_Da) ||
      (std::abs(iVar3), WriteHeader::epsilon < extraout_XMM0_Da_00)) ||
     (std::abs(iVar3), WriteHeader::epsilon < extraout_XMM0_Da_01)) {
    up_axis.field_2._M_local_buf[0xf] = '\x01';
  }
  else {
    up_axis.field_2._8_4_ = (rotation.y + rotation.z + scaling.x) / 3.0;
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_100,"Y_UP",&local_101);
  std::allocator<char>::~allocator(&local_101);
  bVar2 = aiQuaterniont<float>::Equal
                    ((aiQuaterniont<float> *)&position.y,&WriteHeader::x_rot,WriteHeader::epsilon);
  if (bVar2) {
    std::__cxx11::string::operator=(local_100,"X_UP");
  }
  else {
    bVar2 = aiQuaterniont<float>::Equal
                      ((aiQuaterniont<float> *)&position.y,&WriteHeader::y_rot,WriteHeader::epsilon)
    ;
    if (bVar2) {
      std::__cxx11::string::operator=(local_100,"Y_UP");
    }
    else {
      bVar2 = aiQuaterniont<float>::Equal
                        ((aiQuaterniont<float> *)&position.y,&WriteHeader::z_rot,
                         WriteHeader::epsilon);
      if (bVar2) {
        std::__cxx11::string::operator=(local_100,"Z_UP");
      }
      else {
        up_axis.field_2._M_local_buf[0xf] = '\x01';
      }
    }
  }
  aiVector3t<float>::aiVector3t((aiVector3t<float> *)&scene,0.0,0.0,0.0);
  bVar2 = aiVector3t<float>::Equal((aiVector3t<float> *)&scale,(aiVector3t<float> *)&scene,1e-06);
  if (((bVar2 ^ 0xffU) & 1) != 0) {
    up_axis.field_2._M_local_buf[0xf] = '\x01';
  }
  if (this->mScene->mRootNode->mNumChildren == 0) {
    up_axis.field_2._M_local_buf[0xf] = '\x01';
  }
  if ((up_axis.field_2._M_local_buf[0xf] & 1U) != 0) {
    SceneCombiner::CopyScene((aiScene **)&root,this->mScene,true);
    this_00 = (aiNode *)operator_new(0x478);
    meta._6_1_ = 1;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_140,"Scene",(allocator<char> *)((long)&meta + 7));
    aiNode::aiNode(this_00,&local_140);
    meta._6_1_ = 0;
    std::__cxx11::string::~string((string *)&local_140);
    std::allocator<char>::~allocator((allocator<char> *)((long)&meta + 7));
    this_00->mNumChildren = 1;
    local_120 = this_00;
    ppaVar4 = (aiNode **)operator_new__((ulong)this_00->mNumChildren << 3);
    local_120->mChildren = ppaVar4;
    *local_120->mChildren = *(aiNode **)((root->mName).data + 4);
    *(aiNode **)(*(long *)((root->mName).data + 4) + 0x448) = local_120;
    *(aiNode **)((root->mName).data + 4) = local_120;
    this->mScene = (aiScene *)root;
    this->mSceneOwned = true;
    std::__cxx11::string::operator=(local_100,"Y_UP");
    up_axis.field_2._8_4_ = 0x3f800000;
  }
  poVar5 = std::operator<<((ostream *)&this->field_0x38,(string *)&this->startstr);
  poVar5 = std::operator<<(poVar5,"<asset>");
  std::operator<<(poVar5,(string *)&this->endstr);
  PushTag(this);
  poVar5 = std::operator<<((ostream *)&this->field_0x38,(string *)&this->startstr);
  poVar5 = std::operator<<(poVar5,"<contributor>");
  std::operator<<(poVar5,(string *)&this->endstr);
  PushTag(this);
  value.data._1016_8_ = this->mScene->mMetaData;
  if ((aiMetadata *)value.data._1016_8_ == (aiMetadata *)0x0) {
    value.data._1016_8_ = this->mScene->mRootNode->mMetaData;
  }
  aiString::aiString((aiString *)local_554);
  uVar1 = value.data._1016_8_;
  local_57a = 0;
  local_57b = 0;
  local_a19 = 1;
  if (value.data._1016_8_ != 0) {
    std::allocator<char>::allocator();
    local_57a = 1;
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_578,"Author",&local_579);
    local_57b = 1;
    bVar2 = aiMetadata::Get<aiString>((aiMetadata *)uVar1,&local_578,(aiString *)local_554);
    local_a19 = bVar2 ^ 0xff;
  }
  if ((local_57b & 1) != 0) {
    std::__cxx11::string::~string((string *)&local_578);
  }
  if ((local_57a & 1) != 0) {
    std::allocator<char>::~allocator(&local_579);
  }
  if ((local_a19 & 1) == 0) {
    poVar5 = std::operator<<((ostream *)&this->field_0x38,(string *)&this->startstr);
    poVar5 = std::operator<<(poVar5,"<author>");
    pcVar6 = aiString::C_Str((aiString *)local_554);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_5c0,pcVar6,&local_5c1);
    XMLEscape(&local_5a0,&local_5c0);
    poVar5 = std::operator<<(poVar5,(string *)&local_5a0);
    poVar5 = std::operator<<(poVar5,"</author>");
    std::operator<<(poVar5,(string *)&this->endstr);
    std::__cxx11::string::~string((string *)&local_5a0);
    std::__cxx11::string::~string((string *)&local_5c0);
    std::allocator<char>::~allocator(&local_5c1);
  }
  else {
    poVar5 = std::operator<<((ostream *)&this->field_0x38,(string *)&this->startstr);
    poVar5 = std::operator<<(poVar5,"<author>");
    poVar5 = std::operator<<(poVar5,"Assimp");
    poVar5 = std::operator<<(poVar5,"</author>");
    std::operator<<(poVar5,(string *)&this->endstr);
  }
  uVar1 = value.data._1016_8_;
  local_5ea = 0;
  local_5eb = 0;
  local_a89 = 1;
  if (value.data._1016_8_ != 0) {
    std::allocator<char>::allocator();
    local_5ea = 1;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_5e8,"SourceAsset_Generator",&local_5e9);
    local_5eb = 1;
    bVar2 = aiMetadata::Get<aiString>((aiMetadata *)uVar1,&local_5e8,(aiString *)local_554);
    local_a89 = bVar2 ^ 0xff;
  }
  if ((local_5eb & 1) != 0) {
    std::__cxx11::string::~string((string *)&local_5e8);
  }
  if ((local_5ea & 1) != 0) {
    std::allocator<char>::~allocator(&local_5e9);
  }
  if ((local_a89 & 1) == 0) {
    poVar5 = std::operator<<((ostream *)&this->field_0x38,(string *)&this->startstr);
    poVar5 = std::operator<<(poVar5,"<authoring_tool>");
    pcVar6 = aiString::C_Str((aiString *)local_554);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_630,pcVar6,&local_631);
    XMLEscape(&local_610,&local_630);
    poVar5 = std::operator<<(poVar5,(string *)&local_610);
    poVar5 = std::operator<<(poVar5,"</authoring_tool>");
    std::operator<<(poVar5,(string *)&this->endstr);
    std::__cxx11::string::~string((string *)&local_610);
    std::__cxx11::string::~string((string *)&local_630);
    std::allocator<char>::~allocator(&local_631);
  }
  else {
    poVar5 = std::operator<<((ostream *)&this->field_0x38,(string *)&this->startstr);
    poVar5 = std::operator<<(poVar5,"<authoring_tool>");
    poVar5 = std::operator<<(poVar5,"Assimp Exporter");
    poVar5 = std::operator<<(poVar5,"</authoring_tool>");
    std::operator<<(poVar5,(string *)&this->endstr);
  }
  uVar1 = value.data._1016_8_;
  if (value.data._1016_8_ != 0) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_658,"Comments",&local_659);
    bVar2 = aiMetadata::Get<aiString>((aiMetadata *)uVar1,&local_658,(aiString *)local_554);
    std::__cxx11::string::~string((string *)&local_658);
    std::allocator<char>::~allocator(&local_659);
    if (bVar2) {
      poVar5 = std::operator<<((ostream *)&this->field_0x38,(string *)&this->startstr);
      poVar5 = std::operator<<(poVar5,"<comments>");
      pcVar6 = aiString::C_Str((aiString *)local_554);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_6a0,pcVar6,&local_6a1);
      XMLEscape(&local_680,&local_6a0);
      poVar5 = std::operator<<(poVar5,(string *)&local_680);
      poVar5 = std::operator<<(poVar5,"</comments>");
      std::operator<<(poVar5,(string *)&this->endstr);
      std::__cxx11::string::~string((string *)&local_680);
      std::__cxx11::string::~string((string *)&local_6a0);
      std::allocator<char>::~allocator(&local_6a1);
    }
    uVar1 = value.data._1016_8_;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_6c8,"SourceAsset_Copyright",&local_6c9);
    bVar2 = aiMetadata::Get<aiString>((aiMetadata *)uVar1,&local_6c8,(aiString *)local_554);
    std::__cxx11::string::~string((string *)&local_6c8);
    std::allocator<char>::~allocator(&local_6c9);
    if (bVar2) {
      poVar5 = std::operator<<((ostream *)&this->field_0x38,(string *)&this->startstr);
      poVar5 = std::operator<<(poVar5,"<copyright>");
      pcVar6 = aiString::C_Str((aiString *)local_554);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_710,pcVar6,&local_711);
      XMLEscape(&local_6f0,&local_710);
      poVar5 = std::operator<<(poVar5,(string *)&local_6f0);
      poVar5 = std::operator<<(poVar5,"</copyright>");
      std::operator<<(poVar5,(string *)&this->endstr);
      std::__cxx11::string::~string((string *)&local_6f0);
      std::__cxx11::string::~string((string *)&local_710);
      std::allocator<char>::~allocator(&local_711);
    }
    uVar1 = value.data._1016_8_;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_738,"SourceData",&local_739)
    ;
    bVar2 = aiMetadata::Get<aiString>((aiMetadata *)uVar1,&local_738,(aiString *)local_554);
    std::__cxx11::string::~string((string *)&local_738);
    std::allocator<char>::~allocator(&local_739);
    if (bVar2) {
      poVar5 = std::operator<<((ostream *)&this->field_0x38,(string *)&this->startstr);
      poVar5 = std::operator<<(poVar5,"<source_data>");
      pcVar6 = aiString::C_Str((aiString *)local_554);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_780,pcVar6,&local_781);
      XMLEscape(&local_760,&local_780);
      poVar5 = std::operator<<(poVar5,(string *)&local_760);
      poVar5 = std::operator<<(poVar5,"</source_data>");
      std::operator<<(poVar5,(string *)&this->endstr);
      std::__cxx11::string::~string((string *)&local_760);
      std::__cxx11::string::~string((string *)&local_780);
      std::allocator<char>::~allocator(&local_781);
    }
  }
  PopTag(this);
  poVar5 = std::operator<<((ostream *)&this->field_0x38,(string *)&this->startstr);
  poVar5 = std::operator<<(poVar5,"</contributor>");
  std::operator<<(poVar5,(string *)&this->endstr);
  uVar1 = value.data._1016_8_;
  local_7aa = 0;
  local_7ab = 0;
  local_be1 = 1;
  if (value.data._1016_8_ != 0) {
    std::allocator<char>::allocator();
    local_7aa = 1;
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_7a8,"Created",&local_7a9);
    local_7ab = 1;
    bVar2 = aiMetadata::Get<aiString>((aiMetadata *)uVar1,&local_7a8,(aiString *)local_554);
    local_be1 = bVar2 ^ 0xff;
  }
  if ((local_7ab & 1) != 0) {
    std::__cxx11::string::~string((string *)&local_7a8);
  }
  if ((local_7aa & 1) != 0) {
    std::allocator<char>::~allocator(&local_7a9);
  }
  if ((local_be1 & 1) == 0) {
    poVar5 = std::operator<<((ostream *)&this->field_0x38,(string *)&this->startstr);
    poVar5 = std::operator<<(poVar5,"<created>");
    pcVar6 = aiString::C_Str((aiString *)local_554);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_7f0,pcVar6,&local_7f1);
    XMLEscape(&local_7d0,&local_7f0);
    poVar5 = std::operator<<(poVar5,(string *)&local_7d0);
    poVar5 = std::operator<<(poVar5,"</created>");
    std::operator<<(poVar5,(string *)&this->endstr);
    std::__cxx11::string::~string((string *)&local_7d0);
    std::__cxx11::string::~string((string *)&local_7f0);
    std::allocator<char>::~allocator(&local_7f1);
  }
  else {
    poVar5 = std::operator<<((ostream *)&this->field_0x38,(string *)&this->startstr);
    poVar5 = std::operator<<(poVar5,"<created>");
    poVar5 = std::operator<<(poVar5,(char *)&date);
    poVar5 = std::operator<<(poVar5,"</created>");
    std::operator<<(poVar5,(string *)&this->endstr);
  }
  poVar5 = std::operator<<((ostream *)&this->field_0x38,(string *)&this->startstr);
  poVar5 = std::operator<<(poVar5,"<modified>");
  poVar5 = std::operator<<(poVar5,(char *)&date);
  poVar5 = std::operator<<(poVar5,"</modified>");
  std::operator<<(poVar5,(string *)&this->endstr);
  uVar1 = value.data._1016_8_;
  if (value.data._1016_8_ != 0) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_818,"Keywords",&local_819);
    bVar2 = aiMetadata::Get<aiString>((aiMetadata *)uVar1,&local_818,(aiString *)local_554);
    std::__cxx11::string::~string((string *)&local_818);
    std::allocator<char>::~allocator(&local_819);
    if (bVar2) {
      poVar5 = std::operator<<((ostream *)&this->field_0x38,(string *)&this->startstr);
      poVar5 = std::operator<<(poVar5,"<keywords>");
      pcVar6 = aiString::C_Str((aiString *)local_554);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_860,pcVar6,&local_861);
      XMLEscape(&local_840,&local_860);
      poVar5 = std::operator<<(poVar5,(string *)&local_840);
      poVar5 = std::operator<<(poVar5,"</keywords>");
      std::operator<<(poVar5,(string *)&this->endstr);
      std::__cxx11::string::~string((string *)&local_840);
      std::__cxx11::string::~string((string *)&local_860);
      std::allocator<char>::~allocator(&local_861);
    }
    uVar1 = value.data._1016_8_;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_888,"Revision",&local_889);
    bVar2 = aiMetadata::Get<aiString>((aiMetadata *)uVar1,&local_888,(aiString *)local_554);
    std::__cxx11::string::~string((string *)&local_888);
    std::allocator<char>::~allocator(&local_889);
    if (bVar2) {
      poVar5 = std::operator<<((ostream *)&this->field_0x38,(string *)&this->startstr);
      poVar5 = std::operator<<(poVar5,"<revision>");
      pcVar6 = aiString::C_Str((aiString *)local_554);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_8d0,pcVar6,&local_8d1);
      XMLEscape(&local_8b0,&local_8d0);
      poVar5 = std::operator<<(poVar5,(string *)&local_8b0);
      poVar5 = std::operator<<(poVar5,"</revision>");
      std::operator<<(poVar5,(string *)&this->endstr);
      std::__cxx11::string::~string((string *)&local_8b0);
      std::__cxx11::string::~string((string *)&local_8d0);
      std::allocator<char>::~allocator(&local_8d1);
    }
    uVar1 = value.data._1016_8_;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_8f8,"Subject",&local_8f9);
    bVar2 = aiMetadata::Get<aiString>((aiMetadata *)uVar1,&local_8f8,(aiString *)local_554);
    std::__cxx11::string::~string((string *)&local_8f8);
    std::allocator<char>::~allocator(&local_8f9);
    if (bVar2) {
      poVar5 = std::operator<<((ostream *)&this->field_0x38,(string *)&this->startstr);
      poVar5 = std::operator<<(poVar5,"<subject>");
      pcVar6 = aiString::C_Str((aiString *)local_554);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_940,pcVar6,&local_941);
      XMLEscape(&local_920,&local_940);
      poVar5 = std::operator<<(poVar5,(string *)&local_920);
      poVar5 = std::operator<<(poVar5,"</subject>");
      std::operator<<(poVar5,(string *)&this->endstr);
      std::__cxx11::string::~string((string *)&local_920);
      std::__cxx11::string::~string((string *)&local_940);
      std::allocator<char>::~allocator(&local_941);
    }
    uVar1 = value.data._1016_8_;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_968,"Title",&local_969);
    bVar2 = aiMetadata::Get<aiString>((aiMetadata *)uVar1,&local_968,(aiString *)local_554);
    std::__cxx11::string::~string((string *)&local_968);
    std::allocator<char>::~allocator(&local_969);
    if (bVar2) {
      poVar5 = std::operator<<((ostream *)&this->field_0x38,(string *)&this->startstr);
      poVar5 = std::operator<<(poVar5,"<title>");
      pcVar6 = aiString::C_Str((aiString *)local_554);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_9b0,pcVar6,&local_9b1);
      XMLEscape(&local_990,&local_9b0);
      poVar5 = std::operator<<(poVar5,(string *)&local_990);
      poVar5 = std::operator<<(poVar5,"</title>");
      std::operator<<(poVar5,(string *)&this->endstr);
      std::__cxx11::string::~string((string *)&local_990);
      std::__cxx11::string::~string((string *)&local_9b0);
      std::allocator<char>::~allocator(&local_9b1);
    }
  }
  poVar5 = std::operator<<((ostream *)&this->field_0x38,(string *)&this->startstr);
  poVar5 = std::operator<<(poVar5,"<unit name=\"meter\" meter=\"");
  poVar5 = (ostream *)std::ostream::operator<<(poVar5,(float)up_axis.field_2._8_4_);
  poVar5 = std::operator<<(poVar5,"\" />");
  std::operator<<(poVar5,(string *)&this->endstr);
  poVar5 = std::operator<<((ostream *)&this->field_0x38,(string *)&this->startstr);
  poVar5 = std::operator<<(poVar5,"<up_axis>");
  poVar5 = std::operator<<(poVar5,local_100);
  poVar5 = std::operator<<(poVar5,"</up_axis>");
  std::operator<<(poVar5,(string *)&this->endstr);
  PopTag(this);
  poVar5 = std::operator<<((ostream *)&this->field_0x38,(string *)&this->startstr);
  poVar5 = std::operator<<(poVar5,"</asset>");
  std::operator<<(poVar5,(string *)&this->endstr);
  std::__cxx11::string::~string(local_100);
  return;
}

Assistant:

void ColladaExporter::WriteHeader() {
    static const ai_real epsilon = Math::getEpsilon<ai_real>();
    static const aiQuaternion x_rot(aiMatrix3x3(
        0, -1,  0,
        1,  0,  0,
        0,  0,  1));
    static const aiQuaternion y_rot(aiMatrix3x3(
        1,  0,  0,
        0,  1,  0,
        0,  0,  1));
    static const aiQuaternion z_rot(aiMatrix3x3(
        1,  0,  0,
        0,  0,  1,
        0, -1,  0));

    static const unsigned int date_nb_chars = 20;
    char date_str[date_nb_chars];
    std::time_t date = std::time(NULL);
    std::strftime(date_str, date_nb_chars, "%Y-%m-%dT%H:%M:%S", std::localtime(&date));

    aiVector3D scaling;
    aiQuaternion rotation;
    aiVector3D position;
    mScene->mRootNode->mTransformation.Decompose(scaling, rotation, position);
    rotation.Normalize();

    bool add_root_node = false;

    ai_real scale = 1.0;
    if(std::abs(scaling.x - scaling.y) <= epsilon && std::abs(scaling.x - scaling.z) <= epsilon && std::abs(scaling.y - scaling.z) <= epsilon) {
        scale = (ai_real) ((((double) scaling.x) + ((double) scaling.y) + ((double) scaling.z)) / 3.0);
    } else {
        add_root_node = true;
    }

    std::string up_axis = "Y_UP";
    if(rotation.Equal(x_rot, epsilon)) {
        up_axis = "X_UP";
    } else if(rotation.Equal(y_rot, epsilon)) {
        up_axis = "Y_UP";
    } else if(rotation.Equal(z_rot, epsilon)) {
        up_axis = "Z_UP";
    } else {
        add_root_node = true;
    }

    if(! position.Equal(aiVector3D(0, 0, 0))) {
        add_root_node = true;
    }

    if(mScene->mRootNode->mNumChildren == 0) {
        add_root_node = true;
    }

    if(add_root_node) {
        aiScene* scene;
        SceneCombiner::CopyScene(&scene, mScene);

        aiNode* root = new aiNode("Scene");

        root->mNumChildren = 1;
        root->mChildren = new aiNode*[root->mNumChildren];

        root->mChildren[0] = scene->mRootNode;
        scene->mRootNode->mParent = root;
        scene->mRootNode = root;

        mScene = scene;
        mSceneOwned = true;

        up_axis = "Y_UP";
        scale = 1.0;
    }

    mOutput << startstr << "<asset>" << endstr;
    PushTag();
    mOutput << startstr << "<contributor>" << endstr;
    PushTag();

    // If no Scene metadata, use root node metadata
    aiMetadata* meta = mScene->mMetaData;
    if (nullptr == meta) {
        meta = mScene->mRootNode->mMetaData;
    }

    aiString value;
    if (!meta || !meta->Get("Author", value)) {
        mOutput << startstr << "<author>" << "Assimp" << "</author>" << endstr;
    } else {
        mOutput << startstr << "<author>" << XMLEscape(value.C_Str()) << "</author>" << endstr;
    }

    if (nullptr == meta || !meta->Get(AI_METADATA_SOURCE_GENERATOR, value)) {
        mOutput << startstr << "<authoring_tool>" << "Assimp Exporter" << "</authoring_tool>" << endstr;
    } else {
        mOutput << startstr << "<authoring_tool>" << XMLEscape(value.C_Str()) << "</authoring_tool>" << endstr;
    }

    if (meta) {
        if (meta->Get("Comments", value)) {
            mOutput << startstr << "<comments>" << XMLEscape(value.C_Str()) << "</comments>" << endstr;
        }
        if (meta->Get(AI_METADATA_SOURCE_COPYRIGHT, value)) {
            mOutput << startstr << "<copyright>" << XMLEscape(value.C_Str()) << "</copyright>" << endstr;
        }
        if (meta->Get("SourceData", value)) {
            mOutput << startstr << "<source_data>" << XMLEscape(value.C_Str()) << "</source_data>" << endstr;
        }
    }

    PopTag();
    mOutput << startstr << "</contributor>" << endstr;

    if (nullptr == meta || !meta->Get("Created", value)) {
        mOutput << startstr << "<created>" << date_str << "</created>" << endstr;
    } else {
        mOutput << startstr << "<created>" << XMLEscape(value.C_Str()) << "</created>" << endstr;
    }

    // Modified date is always the date saved
    mOutput << startstr << "<modified>" << date_str << "</modified>" << endstr;

    if (meta) {
        if (meta->Get("Keywords", value)) {
            mOutput << startstr << "<keywords>" << XMLEscape(value.C_Str()) << "</keywords>" << endstr;
        }
        if (meta->Get("Revision", value)) {
            mOutput << startstr << "<revision>" << XMLEscape(value.C_Str()) << "</revision>" << endstr;
        }
        if (meta->Get("Subject", value)) {
            mOutput << startstr << "<subject>" << XMLEscape(value.C_Str()) << "</subject>" << endstr;
        }
        if (meta->Get("Title", value)) {
            mOutput << startstr << "<title>" << XMLEscape(value.C_Str()) << "</title>" << endstr;
        }
    }

    mOutput << startstr << "<unit name=\"meter\" meter=\"" << scale << "\" />" << endstr;
    mOutput << startstr << "<up_axis>" << up_axis << "</up_axis>" << endstr;
    PopTag();
    mOutput << startstr << "</asset>" << endstr;
}